

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O3

int __thiscall Database::createNewSlice(Database *this)

{
  undefined8 *puVar1;
  ulong uVar2;
  uint __val;
  pointer pcVar3;
  DatabaseMetadata *pDVar4;
  bool bVar5;
  char cVar6;
  char cVar7;
  int __fd;
  undefined8 *puVar8;
  long *plVar9;
  long *plVar10;
  uint uVar11;
  ulong uVar12;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename;
  undefined8 *local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  ulong *local_88;
  uint local_80;
  undefined4 uStack_7c;
  ulong local_78 [2];
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  __val = this->metadata->sliceCount;
  pcVar3 = (this->file_prefix)._M_dataplus._M_p;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (this->file_prefix)._M_string_length);
  std::__cxx11::string::append((char *)&local_68);
  cVar7 = '\x01';
  if (9 < __val) {
    uVar11 = __val;
    cVar6 = '\x04';
    do {
      cVar7 = cVar6;
      if (uVar11 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_001052b1;
      }
      if (uVar11 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_001052b1;
      }
      if (uVar11 < 10000) goto LAB_001052b1;
      bVar5 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar6 = cVar7 + '\x04';
    } while (bVar5);
    cVar7 = cVar7 + '\x01';
  }
LAB_001052b1:
  local_88 = local_78;
  std::__cxx11::string::_M_construct((ulong)&local_88,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_88,local_80,__val);
  uVar2 = CONCAT44(uStack_7c,local_80) + local_60;
  uVar12 = 0xf;
  if (local_68 != local_58) {
    uVar12 = local_58[0];
  }
  if (uVar12 < uVar2) {
    uVar12 = 0xf;
    if (local_88 != local_78) {
      uVar12 = local_78[0];
    }
    if (uVar2 <= uVar12) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_68);
      goto LAB_00105332;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88);
LAB_00105332:
  local_a8 = &local_98;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_98 = *puVar1;
    uStack_90 = puVar8[3];
  }
  else {
    local_98 = *puVar1;
    local_a8 = (undefined8 *)*puVar8;
  }
  local_a0 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_a8);
  plVar10 = plVar9 + 2;
  if ((long *)*plVar9 == plVar10) {
    local_38 = *plVar10;
    lStack_30 = plVar9[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar10;
    local_48 = (long *)*plVar9;
  }
  local_40 = plVar9[1];
  *plVar9 = (long)plVar10;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  __fd = open((char *)local_48,0x42,0x1a4);
  if (0 < __fd) {
    ftruncate(__fd,0x2000000);
    pDVar4 = this->metadata;
    pDVar4->currentSliceNumber = __val;
    pDVar4->currentOffset = 0;
    pDVar4->sliceCount = pDVar4->sliceCount + 1;
    if (local_48 != &local_38) {
      operator_delete(local_48);
    }
    return __fd;
  }
  __assert_fail("data_fd > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/engine_race/database.cc"
                ,0x6f,"int Database::createNewSlice()");
}

Assistant:

int Database::createNewSlice() {
    auto new_slice_id = metadata->sliceCount;
    auto filename = file_prefix + "." + std::to_string(new_slice_id) + ".data";
    int data_fd = open(filename.c_str(), O_RDWR|O_CREAT, 0644);
    assert(data_fd > 0);
    ftruncate(data_fd, SLICE_SIZE);
    metadata->currentSliceNumber = new_slice_id;
    metadata->currentOffset = 0;
    metadata->sliceCount++;
    return data_fd;
}